

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  cTValue *ptr;
  long lVar2;
  double dVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  IRIns *pIVar7;
  TRef *pTVar8;
  TValue *pTVar9;
  TraceError e;
  IRRef1 IVar10;
  ushort uVar11;
  TRef TVar12;
  TRef TVar13;
  uint uVar14;
  int iVar15;
  BCReg func;
  cTValue *pcVar16;
  cTValue *pcVar17;
  IRRef1 IVar18;
  uint uVar19;
  ulong uVar20;
  IRRef1 *pIVar21;
  long lVar22;
  ushort uVar23;
  GCtab *t;
  IROpT IVar24;
  code *cont;
  ulong uVar25;
  bool bVar26;
  uint uVar27;
  ptrdiff_t pStack_60;
  
  pTVar9 = &ix->keyv;
  ptr = (cTValue *)(J[-1].penalty + 0x38);
  TVar13 = ix->tab;
LAB_00127c91:
  if ((TVar13 & 0x1f000000) != 0xb000000) {
    iVar15 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
    if (iVar15 == 0) {
      e = LJ_TRERR_NOMM;
      goto LAB_001286e4;
    }
    goto LAB_00128258;
  }
  uVar14 = (ix->keyv).field_2.it;
  if ((uVar14 == 0xffffffff) || ((uVar14 < 0xfffeffff && (NAN(pTVar9->n))))) {
    if (ix->val != 0) {
      e = LJ_TRERR_STORENN;
      goto LAB_001286e4;
    }
    if ((ix->key & 0x8000) != 0) goto LAB_00127cd6;
  }
  else {
LAB_00127cd6:
    t = (GCtab *)(ulong)(ix->tabv).u32.lo;
    pcVar16 = lj_tab_get(J->L,t,pTVar9);
    ix->oldv = pcVar16;
    uVar14 = ix->key;
    if ((uVar14 >> 0x18 & 0x1e) - 0xe < 6) {
      dVar3 = pTVar9->n;
      uVar27 = (int)dVar3;
      if ((double)(int)dVar3 != dVar3) {
        uVar27 = 0x8000001;
      }
      if (NAN((double)(int)dVar3) || NAN(dVar3)) {
        uVar27 = 0x8000001;
      }
      if (0x8000000 < uVar27) {
        if (-1 < (short)uVar14) goto LAB_00127ef4;
        if (t->asize != 0) {
          e = LJ_TRERR_NYITMIX;
          goto LAB_001286e4;
        }
        (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130006;
        TVar13 = lj_opt_fold(J);
        TVar12 = lj_ir_kint(J,0);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
        goto LAB_00127ef4;
      }
      if ((uVar14 & 0x1f000000) == 0xe000000) {
        IVar18 = 0x226e;
        IVar24 = 0x5593;
        uVar19 = uVar14;
LAB_00127d51:
        (J->fold).ins.field_0.ot = IVar24;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar19;
        (J->fold).ins.field_0.op2 = IVar18;
        TVar12 = lj_opt_fold(J);
        TVar13 = ix->tab;
      }
      else {
        pIVar7 = (J->cur).ir;
        uVar20 = (ulong)(uVar14 & 0xffff);
        bVar4 = *(byte *)((long)pIVar7 + uVar20 * 8 + 5);
        TVar12 = uVar14;
        if ((byte)(bVar4 - 0x35) < 2) {
          IVar18 = *(IRRef1 *)((long)pIVar7 + uVar20 * 8 + 2);
          if ((-1 < (long)(short)IVar18) &&
             (-1 < (int)(pIVar7[(short)IVar18].field_1.op12 + 0x40000000))) {
            IVar24 = (ushort)bVar4 * 0x100 - 0xced;
            uVar19 = (uint)pIVar7[uVar20].field_0.op1;
            goto LAB_00127d51;
          }
        }
      }
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130006;
      TVar13 = lj_opt_fold(J);
      if (t->asize <= uVar27) {
        (J->fold).ins.field_0.ot = 0x693;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
        if (uVar27 == 0 && (uVar14 & 0x8000) == 0) {
          uVar14 = lj_ir_knum_u64(J,0);
        }
        goto LAB_00127ef4;
      }
      rec_idx_abc(J,TVar13,TVar12,t->asize);
      (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050004;
      TVar13 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x3805;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
LAB_0012801d:
      uVar14 = lj_opt_fold(J);
    }
    else {
LAB_00127ef4:
      if (t->hmask != 0) {
        if ((uVar14 >> 0x18 & 0x1f) - 0xf < 5) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
          uVar14 = lj_opt_fold(J);
        }
        if ((((short)(IRRef1)uVar14 < 0) || (t->hmask == 0)) ||
           (uVar27 = *(int *)&ix->oldv - (t->node).ptr32,
           0x17ffe8 < uVar27 || t->hmask * 0x18 < uVar27)) {
          TVar13 = ix->tab;
          (J->fold).ins.field_0.ot = 0x3a05;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
        }
        else {
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130007;
          TVar13 = lj_opt_fold(J);
          TVar12 = lj_ir_kint(J,t->hmask);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
          lj_opt_fold(J);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050005;
          TVar13 = lj_opt_fold(J);
          TVar12 = lj_ir_kslot(J,uVar14,uVar27 / 0x18);
          (J->fold).ins.field_0.ot = 0x3985;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        }
        goto LAB_0012801d;
      }
      (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130007;
      TVar13 = lj_opt_fold(J);
      TVar12 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x893;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
      lj_opt_fold(J);
      uVar14 = lj_ir_kptr_(J,IR_KKPTR,ptr);
    }
    IVar18 = (IRRef1)uVar14;
    pIVar7 = (J->cur).ir;
    uVar20 = (ulong)uVar14 & 0xffff;
    cVar5 = *(char *)((long)pIVar7 + uVar20 * 8 + 5);
    if (cVar5 == '\x19') {
      pcVar16 = (cTValue *)(ulong)pIVar7[uVar20].field_1.op12;
    }
    else {
      pcVar16 = ix->oldv;
    }
    uVar27 = cVar5 == '8' ^ 0x41;
    uVar14 = ix->val;
    if (uVar14 != 0) {
      uVar19 = ix->key;
      uVar6 = *(uint *)((ulong)(ix->tabv).u32.lo + 0x10);
      if ((pcVar16->field_2).it != 0xffffffff) {
        bVar26 = (uVar14 & 0x1f000000) != 0 && (uVar19 >> 0x18 & 0x1f) - 4 < 9;
        pIVar21 = J->chain + (ulong)uVar27 + 7;
        goto LAB_00128388;
      }
      if (((ix->idxchain == 0) || (uVar6 == 0)) ||
         ((pcVar17 = lj_tab_getstr((GCtab *)(ulong)uVar6,(GCstr *)(ulong)J[-1].bpropcache[10].mode),
          pcVar17 == (cTValue *)0x0 || ((pcVar17->field_2).it == 0xffffffff)))) {
        if (cVar5 == ':') {
          uVar23 = (ushort)(pcVar16 != ptr) << 8 | 0x885;
          TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          IVar10 = (IRRef1)TVar13;
          goto LAB_00128146;
        }
      }
      else {
        uVar23 = (ushort)(uVar27 << 8) | 0x80;
        IVar10 = 0;
LAB_00128146:
        (J->fold).ins.field_0.ot = uVar23;
        (J->fold).ins.field_0.op1 = IVar18;
        (J->fold).ins.field_0.op2 = IVar10;
        lj_opt_fold(J);
      }
      if ((ix->idxchain != 0) && (iVar15 = lj_record_mm_lookup(J,ix,MM_newindex), iVar15 != 0))
      goto LAB_00128258;
      if (pcVar16 != ptr) {
        bVar26 = (uVar14 & 0x1f000000) != 0 && (uVar19 >> 0x18 & 0x1f) - 4 < 9;
        goto LAB_00128489;
      }
      uVar14 = ix->key;
      if ((uVar14 >> 0x18 & 0x1f) - 0xf < 5) {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
        uVar14 = lj_opt_fold(J);
      }
      TVar13 = ix->tab;
      (J->fold).ins.field_0.ot = 0x3b05;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
      TVar13 = lj_opt_fold(J);
      IVar18 = (IRRef1)TVar13;
      goto LAB_00128486;
    }
    uVar14 = (pcVar16->field_2).it;
    uVar19 = ~uVar14;
    if ((uVar14 & 0xffff8000) == 0xffff0000) {
      uVar19 = 3;
    }
    if (uVar14 < 0xfffeffff) {
      uVar19 = 0xe;
    }
    if (pcVar16 == ptr) {
      TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
      (J->fold).ins.field_0.ot = 0x885;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
      lj_opt_fold(J);
      TVar13 = 0x7fff;
    }
    else {
      (J->fold).ins.field_0.ot = (ushort)(uVar27 << 8) | (ushort)uVar19 | 0x80;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = 0;
      TVar13 = lj_opt_fold(J);
    }
    if (uVar19 != 0) {
      if (uVar19 < 3) {
        return uVar19 * 0xffffff + 0x7fff;
      }
      return TVar13;
    }
  }
  if (ix->idxchain == 0) {
    return 0x7fff;
  }
  iVar15 = lj_record_mm_lookup(J,ix,MM_index);
  if (iVar15 == 0) {
    return 0x7fff;
  }
LAB_00128258:
  TVar13 = ix->mobj;
  if ((TVar13 & 0x1f000000) == 0x8000000) {
    cont = lj_cont_nop;
    if (ix->val == 0) {
      cont = lj_cont_ra;
    }
    func = rec_mm_prep(J,cont);
    pTVar8 = J->base;
    uVar20 = (ulong)func;
    pTVar9 = J->L->base;
    pTVar8[uVar20] = ix->mobj;
    pTVar8[uVar20 + 1] = ix->tab;
    pTVar8[uVar20 + 2] = ix->key;
    pTVar9[uVar20].field_2.field_0 = (ix->mobjv).field_2.field_0;
    *(undefined4 *)((long)pTVar9 + uVar20 * 8 + 4) = 0xfffffff7;
    pTVar9[uVar20 + 1].field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)ix->tabv;
    pTVar9[uVar20 + 2] = ix->keyv;
    if (ix->val == 0) {
      pStack_60 = 2;
    }
    else {
      pTVar8[uVar20 + 3] = ix->val;
      pTVar9[uVar20 + 3] = ix->valv;
      pStack_60 = 3;
    }
    lj_record_call(J,func,pStack_60);
    return 0;
  }
  ix->tab = TVar13;
  ix->tabv = ix->mobjv;
  piVar1 = &ix->idxchain;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    e = LJ_TRERR_IDXLOOP;
LAB_001286e4:
    lj_trace_err(J,e);
  }
  goto LAB_00127c91;
LAB_00128388:
  uVar25 = (ulong)*pIVar21;
  if (*pIVar21 <= IVar18) goto LAB_0012845b;
  if (pIVar7[uVar25].field_0.op1 == IVar18) goto LAB_0012847b;
  if (((&pIVar7->field_1)[uVar25].t.irt & 0x1f) == 0) {
    uVar23 = *(ushort *)((long)pIVar7 + (ulong)pIVar7[uVar25].field_0.op1 * 8 + 2);
    uVar11 = *(ushort *)((long)pIVar7 + uVar20 * 8 + 2);
    if (((cVar5 == '8') ||
        (((*(byte *)((long)pIVar7 + (ulong)uVar11 * 8 + 4) ^
          *(byte *)((long)pIVar7 + (ulong)uVar23 * 8 + 4)) & 0x1f) == 0)) &&
       ((uVar23 == uVar11 || ((short)(uVar23 | uVar11) < 0)))) goto LAB_001285c6;
  }
  pIVar21 = &(&pIVar7->field_0)[uVar25].prev;
  goto LAB_00128388;
LAB_0012845b:
  pIVar21 = J->chain + uVar27;
  do {
    uVar25 = (ulong)*pIVar21;
    if (*pIVar21 <= IVar18) goto LAB_001285c6;
    pIVar21 = &pIVar7[uVar25].field_0.prev;
  } while (pIVar7[uVar25].field_0.op1 != IVar18);
LAB_0012847b:
  if ((*(byte *)((long)pIVar7 + uVar25 * 8 + 4) & 0x1f) == 0) {
LAB_001285c6:
    if (cVar5 == ':') {
      TVar13 = lj_ir_kptr_(J,IR_KKPTR,ptr);
      (J->fold).ins.field_0.ot = 0x985;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar13;
      lj_opt_fold(J);
    }
    if (ix->idxchain != 0) {
      if ((GCtab *)(ulong)uVar6 == (GCtab *)0x0) {
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x430b0003;
        TVar13 = lj_opt_fold(J);
        TVar12 = lj_ir_knull(J,IRT_TAB);
        (J->fold).ins.field_0.ot = 0x88b;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        lj_opt_fold(J);
      }
      else {
        uVar14 = (pcVar16->field_2).it;
        uVar23 = 0x83;
        if ((uVar14 & 0xffff8000) != 0xffff0000) {
          uVar23 = ~(ushort)uVar14 | 0x80;
        }
        uVar11 = 0x8e;
        if (0xfffefffe < uVar14) {
          uVar11 = uVar23;
        }
        (J->fold).ins.field_0.ot = uVar11 | (ushort)(uVar27 << 8);
        (J->fold).ins.field_0.op1 = IVar18;
        (J->fold).ins.field_0.op2 = 0;
        lj_opt_fold(J);
      }
    }
  }
  else {
LAB_00128486:
    bVar26 = false;
  }
LAB_00128489:
  uVar14 = ix->val;
  uVar19 = uVar14 >> 0x18 & 0x1f;
  if (uVar19 - 0xf < 5) {
    (J->fold).ins.field_0.op1 = (IRRef1)uVar14;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
    uVar14 = lj_opt_fold(J);
    ix->val = uVar14;
    uVar19 = uVar14 >> 0x18 & 0x1f;
  }
  (J->fold).ins.field_0.ot = (short)uVar19 + (short)uVar27 * 0x100 + 0x700;
  (J->fold).ins.field_0.op1 = IVar18;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar14;
  lj_opt_fold(J);
  if ((bVar26) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x52000000;
    lj_opt_fold(J);
  }
  uVar14 = ix->key;
  if ((uVar14 & 0x1f000000) == 0x4000000) {
    if (-1 < (short)uVar14) {
      lVar22 = 0;
      do {
        if (lVar22 == 6) goto LAB_001285ac;
        lVar2 = lVar22 * 4;
        lVar22 = lVar22 + 1;
      } while (*(IRRef2 *)((long)J + lVar2 + -0x98) != (J->cur).ir[uVar14 & 0x7fff].field_1.op12);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e050008;
    TVar13 = lj_opt_fold(J);
    TVar12 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x4a10;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
    lj_opt_fold(J);
  }
LAB_001285ac:
  J->needsnap = '\x01';
  return 0;
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lua_assert(ix->idxchain != 0);
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func;
      TValue *tv = J->L->base + func;
      base[0] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv+0, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_P32),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lua_assert(hasmm);
	goto handlemm;
      }
      lua_assert(!hasmm);
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key))  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	xref = emitir(IRT(IR_NEWREF, IRT_P32), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_P32), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}